

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantSetSuppAnd(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iObj_00;
  int iVar2;
  word *pOut;
  word *pIn1;
  word *pIn2;
  int iFan1;
  int iFan0;
  int iObj;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjId(p,pObj);
  iObj_00 = Gia_ObjFaninId0(pObj,iVar1);
  iVar1 = Gia_ObjFaninId1(pObj,iVar1);
  iVar2 = Gia_ObjIsAnd(pObj);
  if (iVar2 != 0) {
    Gia_ManQuantSetSuppZero(p);
    pOut = Gia_ManQuantInfo(p,pObj);
    pIn1 = Gia_ManQuantInfoId(p,iObj_00);
    pIn2 = Gia_ManQuantInfoId(p,iVar1);
    Abc_TtOr(pOut,pIn1,pIn2,p->nSuppWords);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                ,0x95,"void Gia_ManQuantSetSuppAnd(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManQuantSetSuppAnd( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int iObj  = Gia_ObjId(p, pObj);
    int iFan0 = Gia_ObjFaninId0(pObj, iObj);
    int iFan1 = Gia_ObjFaninId1(pObj, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManQuantSetSuppZero( p );
    Abc_TtOr( Gia_ManQuantInfo(p, pObj), Gia_ManQuantInfoId(p, iFan0), Gia_ManQuantInfoId(p, iFan1), p->nSuppWords );
}